

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Init.cpp
# Opt level: O0

void Handlers::Init_Init(EOClient *client,PacketReader *reader)

{
  World *pWVar1;
  byte bVar2;
  uchar uVar3;
  bool bVar4;
  pair<unsigned_char,_unsigned_char> pVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  EOServer *pEVar11;
  list<Client_*,_std::allocator<Client_*>_> *this;
  reference ppCVar12;
  mapped_type *pmVar13;
  long lVar14;
  time_t tVar15;
  double *pdVar16;
  byte local_3d2;
  bool local_3ae;
  bool local_3ad;
  int *local_300;
  bool local_279;
  uchar local_242;
  uchar uStack_241;
  uchar local_240;
  uchar uStack_23c;
  pair<unsigned_char,_unsigned_char> seq_bytes;
  int emulti_d;
  int emulti_e;
  key_type local_230;
  bool local_20a;
  allocator<char> local_209;
  undefined1 local_208 [6];
  bool accepted_version;
  int local_1e8;
  allocator<char> local_1e1;
  int maxversion;
  allocator<char> local_1b9;
  key_type local_1b8;
  int local_194;
  double dStack_190;
  int minversion;
  double local_188;
  int local_180;
  IPAddress local_17c;
  int mins_remaining;
  IPAddress local_174;
  int local_170;
  IPAddress remote_addr;
  int ban_expires;
  char errbuf [64];
  key_type local_120;
  int local_100;
  allocator<char> local_f9;
  int max_per_pc;
  byte local_d1;
  IPAddress local_d0;
  IPAddress IStack_cc;
  bool ignore_hdid;
  EOClient *local_c8;
  EOClient *checkeoclient;
  Client *checkclient;
  iterator __end1;
  iterator __begin1;
  list<Client_*,_std::allocator<Client_*>_> *__range1;
  int pc_connections;
  invalid_argument *anon_var_0;
  string hdid_str;
  uint hdid_len;
  uint prot;
  uint response;
  uint challenge;
  PacketBuilder reply;
  PacketReader *reader_local;
  EOClient *client_local;
  
  reply.add_size = (size_t)reader;
  PacketBuilder::PacketBuilder((PacketBuilder *)&response,PACKET_F_INIT,PACKET_A_INIT,10);
  uVar6 = PacketReader::GetThree((PacketReader *)reply.add_size);
  PacketReader::GetChar((PacketReader *)reply.add_size);
  PacketReader::GetChar((PacketReader *)reply.add_size);
  bVar2 = PacketReader::GetChar((PacketReader *)reply.add_size);
  client->version = (uint)bVar2;
  uVar3 = PacketReader::GetChar((PacketReader *)reply.add_size);
  bVar2 = PacketReader::GetChar((PacketReader *)reply.add_size);
  hdid_str.field_2._12_4_ = ZEXT14(bVar2);
  PacketReader::GetEndString_abi_cxx11_((string *)&anon_var_0,(PacketReader *)reply.add_size);
  uVar7 = util::to_uint_raw((string *)&anon_var_0);
  client->hdid = uVar7;
  uVar10 = std::__cxx11::string::length();
  if (uVar10 == (uint)hdid_str.field_2._12_4_) {
    __range1._0_4_ = 0;
    pEVar11 = EOClient::server(client);
    this = &(pEVar11->super_Server).clients;
    __end1 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(this);
    checkclient = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(this);
    while (bVar4 = std::operator!=(&__end1,(_Self *)&checkclient), bVar4) {
      ppCVar12 = std::_List_iterator<Client_*>::operator*(&__end1);
      local_c8 = (EOClient *)*ppCVar12;
      local_279 = false;
      checkeoclient = local_c8;
      if (local_c8->hdid == client->hdid) {
        IStack_cc = Client::GetRemoteAddr((Client *)local_c8);
        local_d0 = Client::GetRemoteAddr(&client->super_Client);
        local_279 = IPAddress::operator==(&stack0xffffffffffffff34,&local_d0);
      }
      if (local_279 != false) {
        __range1._0_4_ = (int)__range1 + 1;
      }
      std::_List_iterator<Client_*>::operator++(&__end1);
    }
    pEVar11 = EOClient::server(client);
    pWVar1 = pEVar11->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&max_per_pc,"IgnoreHDID",&local_f9)
    ;
    pmVar13 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar1->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,(key_type *)&max_per_pc);
    bVar4 = util::variant::operator_cast_to_bool(pmVar13);
    std::__cxx11::string::~string((string *)&max_per_pc);
    std::allocator<char>::~allocator(&local_f9);
    local_d1 = bVar4;
    if (!bVar4) {
      pEVar11 = EOClient::server(client);
      pWVar1 = pEVar11->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"MaxConnectionsPerPC",(allocator<char> *)(errbuf + 0x3f));
      pmVar13 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&(pWVar1->config).
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_120);
      iVar8 = util::variant::operator_cast_to_int(pmVar13);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)(errbuf + 0x3f));
      local_100 = iVar8;
      if ((iVar8 != 0) && (iVar8 < (int)__range1)) {
        snprintf((char *)&ban_expires,0x40,"too many connections from this PC: %08x",
                 (ulong)(uint)client->hdid);
        pEVar11 = EOClient::server(client);
        remote_addr = Client::GetRemoteAddr(&client->super_Client);
        EOServer::RecordClientRejection(pEVar11,&remote_addr,(char *)&ban_expires);
        Client::Close(&client->super_Client,true);
        goto LAB_001b8170;
      }
    }
    local_174 = Client::GetRemoteAddr(&client->super_Client);
    pEVar11 = EOClient::server(client);
    if ((local_d1 & 1) == 0) {
      local_300 = &client->hdid;
    }
    else {
      local_300 = (int *)0x0;
    }
    local_170 = World::CheckBan(pEVar11->world,(string *)0x0,&local_174,local_300);
    if (local_170 == -1) {
      pEVar11 = EOClient::server(client);
      pWVar1 = pEVar11->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"MinVersion",&local_1b9);
      pmVar13 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&(pWVar1->config).
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_1b8);
      iVar8 = util::variant::operator_cast_to_int(pmVar13);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      local_194 = iVar8;
      if (iVar8 == 0) {
        pEVar11 = EOClient::server(client);
        pWVar1 = pEVar11->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&maxversion,"OldVersionCompat",&local_1e1);
        pmVar13 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  ::operator[](&(pWVar1->config).
                                super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               ,(key_type *)&maxversion);
        bVar4 = util::variant::operator_cast_to_bool(pmVar13);
        local_194 = 0x1c;
        if (bVar4) {
          local_194 = 0x1b;
        }
        std::__cxx11::string::~string((string *)&maxversion);
        std::allocator<char>::~allocator(&local_1e1);
      }
      pEVar11 = EOClient::server(client);
      pWVar1 = pEVar11->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_208,"MaxVersion",&local_209);
      pmVar13 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&(pWVar1->config).
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,(key_type *)local_208);
      iVar8 = util::variant::operator_cast_to_int(pmVar13);
      std::__cxx11::string::~string((string *)local_208);
      std::allocator<char>::~allocator(&local_209);
      local_1e8 = iVar8;
      if (iVar8 == 0) {
        local_1e8 = 0x1c;
      }
      local_3ad = false;
      if (local_194 <= client->version) {
        local_3ae = true;
        if (-1 < local_1e8) {
          local_3ae = client->version <= local_1e8;
        }
        local_3ad = local_3ae;
      }
      local_20a = local_3ad;
      if (uVar3 != 'p') {
        local_20a = false;
      }
      pEVar11 = EOClient::server(client);
      pWVar1 = pEVar11->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"CheckVersion",(allocator<char> *)((long)&emulti_e + 3));
      pmVar13 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&(pWVar1->config).
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_230);
      bVar4 = util::variant::operator_cast_to_bool(pmVar13);
      local_3d2 = 0;
      if (bVar4) {
        local_3d2 = local_20a ^ 0xff;
      }
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)((long)&emulti_e + 3));
      if ((local_3d2 & 1) == 0) {
        uVar6 = stupid_hash(uVar6);
        iVar8 = util::rand();
        iVar9 = util::rand();
        EOClient::InitNewSequence(client);
        pVar5 = EOClient::GetSeqInitBytes(client);
        PacketBuilder::AddByte((PacketBuilder *)&response,'\x02');
        local_242 = pVar5.first;
        PacketBuilder::AddByte((PacketBuilder *)&response,local_242);
        uStack_241 = pVar5.second;
        PacketBuilder::AddByte((PacketBuilder *)&response,uStack_241);
        uStack_23c = (uchar)iVar8;
        PacketBuilder::AddByte((PacketBuilder *)&response,uStack_23c);
        local_240 = (uchar)iVar9;
        PacketBuilder::AddByte((PacketBuilder *)&response,local_240);
        PacketBuilder::AddShort((PacketBuilder *)&response,client->id);
        PacketBuilder::AddThree((PacketBuilder *)&response,uVar6);
        PacketProcessor::SetEMulti(&client->processor,uStack_23c,local_240);
        EOClient::Send(client,(PacketBuilder *)&response);
        client->state = Initialized;
      }
      else {
        pEVar11 = EOClient::server(client);
        emulti_d = (int)Client::GetRemoteAddr(&client->super_Client);
        EOServer::RecordClientRejection(pEVar11,(IPAddress *)&emulti_d,"out of date");
        PacketBuilder::AddByte((PacketBuilder *)&response,'\x01');
        PacketBuilder::AddChar((PacketBuilder *)&response,0);
        PacketBuilder::AddChar((PacketBuilder *)&response,0);
        PacketBuilder::AddChar((PacketBuilder *)&response,local_194);
        EOClient::Send(client,(PacketBuilder *)&response);
        Client::Close(&client->super_Client,false);
      }
    }
    else {
      PacketBuilder::AddByte((PacketBuilder *)&response,'\x03');
      if (local_170 == 0) {
        pEVar11 = EOClient::server(client);
        mins_remaining = (int)Client::GetRemoteAddr(&client->super_Client);
        EOServer::RecordClientRejection(pEVar11,(IPAddress *)&mins_remaining,"perm ban");
        PacketBuilder::AddByte((PacketBuilder *)&response,'\x02');
      }
      else {
        pEVar11 = EOClient::server(client);
        local_17c = Client::GetRemoteAddr(&client->super_Client);
        EOServer::RecordClientRejection(pEVar11,&local_17c,"temp ban");
        local_188 = 255.0;
        lVar14 = (long)local_170;
        tVar15 = time((time_t *)0x0);
        dStack_190 = ceil((double)(lVar14 - tVar15) / 60.0);
        pdVar16 = std::min<double>(&local_188,&stack0xfffffffffffffe70);
        local_180 = (int)*pdVar16;
        PacketBuilder::AddByte((PacketBuilder *)&response,'\0');
        PacketBuilder::AddByte((PacketBuilder *)&response,(uchar)local_180);
      }
      EOClient::Send(client,(PacketBuilder *)&response);
      Client::Close(&client->super_Client,false);
    }
  }
  else {
    pEVar11 = EOClient::server(client);
    __range1._4_4_ = Client::GetRemoteAddr(&client->super_Client);
    EOServer::RecordClientRejection(pEVar11,(IPAddress *)((long)&__range1 + 4),"bad hdid");
    Client::Close(&client->super_Client,true);
  }
LAB_001b8170:
  pc_connections = 1;
  std::__cxx11::string::~string((string *)&anon_var_0);
  PacketBuilder::~PacketBuilder((PacketBuilder *)&response);
  return;
}

Assistant:

void Init_Init(EOClient *client, PacketReader &reader)
{
	PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 10);

	unsigned int challenge;
	unsigned int response;

	challenge = reader.GetThree();

	reader.GetChar(); // ?
	reader.GetChar(); // ?
	client->version = reader.GetChar();
	unsigned prot = reader.GetChar();
	unsigned hdid_len = reader.GetChar();
	std::string hdid_str = reader.GetEndString();

	try
	{
		client->hdid = int(util::to_uint_raw(hdid_str));
	}
	catch (std::invalid_argument&)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "bad hdid");
		client->Close(true);
		return;
	}

	if (hdid_str.length() != hdid_len)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "bad hdid");
		client->Close(true);
		return;
	}

	int pc_connections = 0;

	UTIL_FOREACH(client->server()->clients, checkclient)
	{
		EOClient *checkeoclient = static_cast<EOClient *>(checkclient);

		if (checkeoclient->hdid == client->hdid && checkeoclient->GetRemoteAddr() == client->GetRemoteAddr())
		{
			++pc_connections;
		}
	}

	const bool ignore_hdid = client->server()->world->config["IgnoreHDID"];

	if (!ignore_hdid)
	{
		const int max_per_pc = int(client->server()->world->config["MaxConnectionsPerPC"]);

		if (max_per_pc != 0 && pc_connections > max_per_pc)
		{
			char errbuf[64];
			std::snprintf(errbuf, sizeof errbuf, "too many connections from this PC: %08x", client->hdid);
			client->server()->RecordClientRejection(client->GetRemoteAddr(), errbuf);
			client->Close(true);
			return;
		}
	}

	int ban_expires;
	IPAddress remote_addr = client->GetRemoteAddr();
	if ((ban_expires = client->server()->world->CheckBan(0, &remote_addr, ignore_hdid ? 0 : &client->hdid)) != -1)
	{
		reply.AddByte(INIT_BANNED);
		if (ban_expires == 0)
		{
			client->server()->RecordClientRejection(client->GetRemoteAddr(), "perm ban");
			reply.AddByte(INIT_BAN_PERM);
		}
		else
		{
			client->server()->RecordClientRejection(client->GetRemoteAddr(), "temp ban");
			int mins_remaining = int(std::min(255.0, std::ceil(double(ban_expires - std::time(0)) / 60.0)));
			reply.AddByte(INIT_BAN_TEMP);
			reply.AddByte(mins_remaining);
		}
		client->Send(reply);
		client->Close();
		return;
	}

	int minversion = client->server()->world->config["MinVersion"];
	if (!minversion)
	{
		minversion = client->server()->world->config["OldVersionCompat"] ? 27 : 28;
	}

	int maxversion = client->server()->world->config["MaxVersion"];
	if (!maxversion)
	{
		maxversion = 28;
	}

	bool accepted_version = client->version >= minversion && (maxversion < 0 || client->version <= maxversion);

	if (prot != 112)
		accepted_version = false;

	if (client->server()->world->config["CheckVersion"] && !accepted_version)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "out of date");
		reply.AddByte(INIT_OUT_OF_DATE);
		reply.AddChar(0);
		reply.AddChar(0);
		reply.AddChar(minversion);
		client->Send(reply);
		client->Close();
		return;
	}

	response = stupid_hash(challenge);

	int emulti_e = util::rand(6,12);
	int emulti_d = util::rand(6,12);

	client->InitNewSequence();
	auto seq_bytes = client->GetSeqInitBytes();

	reply.AddByte(INIT_OK);
	reply.AddByte(seq_bytes.first);
	reply.AddByte(seq_bytes.second);
	reply.AddByte(emulti_e);
	reply.AddByte(emulti_d);
	reply.AddShort(client->id);
	reply.AddThree(response);

	client->processor.SetEMulti(emulti_e, emulti_d);

	client->Send(reply);

	client->state = EOClient::Initialized;

	return;
}